

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

AtomicSort * Kernel::AtomicSort::create(uint typeCon,uint arity,TermList *args)

{
  anon_class_24_3_776da329 create;
  anon_class_24_3_7d9c329f isCorrectVal;
  bool bVar1;
  bool *inserted;
  AtomicSort **ppAVar2;
  IterTraits<Lib::RangeIterator<unsigned_int>_> IVar3;
  AtomicSort *shared;
  bool created;
  anon_class_24_3_776da329 allocTerm;
  bool share;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *in_stack_ffffffffffffff30;
  anon_class_8_1_89897ddb in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff78;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff80;
  anon_class_8_1_8991fb9c getArg;
  anon_class_24_3_776da329 *this;
  TermList **ppTVar4;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar5;
  anon_class_8_1_8991fb9c aVar6;
  AtomicSort *local_38;
  uint local_30;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar7;
  TermList *local_18;
  undefined1 local_10 [8];
  AtomicSort *local_8;
  
  IVar3 = Lib::$_0::operator()
                    (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (uint)in_stack_ffffffffffffff78);
  local_38 = IVar3._iter._0_8_;
  local_30 = IVar3._iter._to;
  bVar1 = Lib::IterTraits<Lib::RangeIterator<unsigned_int>>::
          all<Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__0>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  getArg.this = (Literal *)local_10;
  this = (anon_class_24_3_776da329 *)(local_10 + 4);
  ppTVar4 = &local_18;
  if (bVar1) {
    bVar5 = 0;
    inserted = (bool *)(DAT_01333838 + 0x50);
    aVar6.this = getArg.this;
    Term::
    termHash<Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__3>
              ((uint)((ulong)&local_18 >> 0x20),getArg,(uint)&local_18);
    create.typeCon = (uint *)this;
    create.arity = (uint *)getArg.this;
    create.args = ppTVar4;
    isCorrectVal.arity._0_7_ = in_stack_ffffffffffffffa0;
    isCorrectVal.typeCon = (uint *)in_stack_ffffffffffffff98;
    isCorrectVal.arity._7_1_ = bVar5;
    isCorrectVal.args = (TermList **)aVar6.this;
    ppAVar2 = Lib::Set<Kernel::AtomicSort*,Indexing::TermSharing>::
              rawFindOrInsert<Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__1,Kernel::AtomicSort::create(unsigned_int,unsigned_int,Kernel::TermList_const*)::__2>
                        ((Set<Kernel::AtomicSort_*,_Indexing::TermSharing> *)local_10,create,
                         (uint)((ulong)(local_10 + 4) >> 0x20),isCorrectVal,inserted);
    local_8 = *ppAVar2;
    if ((bVar5 & 1) != 0) {
      Indexing::TermSharing::computeAndSetSharedSortData
                ((TermSharing *)CONCAT44(uVar7,local_30),local_38);
    }
  }
  else {
    local_8 = AtomicSort::create::anon_class_24_3_776da329::operator()(this);
  }
  return local_8;
}

Assistant:

AtomicSort* AtomicSort::create(unsigned typeCon, unsigned arity, const TermList* args)
{
  ASS_EQ(env.signature->typeConArity(typeCon), arity);

  bool share = range(0, arity).all([&](auto i) { return argSafeToShare(args[i]); });

  auto allocTerm = [&]() {
    AtomicSort* s = new(arity) AtomicSort(typeCon,arity);
    s->makeSymbol(typeCon,arity);
    for (auto i : range(0, arity)) {
      *s->nthArgument(i) = args[i];
    }
    return s;
  };

  if (share) {
    bool created = false;
    auto shared =
      env.sharing->_sorts.rawFindOrInsert(allocTerm,
        Term::termHash(typeCon, [&](auto i){ return args[i]; }, arity),
        [&](AtomicSort* t) { return t->functor() == typeCon && range(0, arity).all([&](auto i) { return args[i] == *t->nthArgument(i); }); },
        created
        );
    if (created) {
      env.sharing->computeAndSetSharedSortData(shared);
    }
    return shared;
  } else {
    return allocTerm();
  }
}